

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heap.c
# Opt level: O0

_Bool mi_heap_check_owned(mi_heap_t *heap,void *p)

{
  _Bool _Var1;
  ulong in_RSI;
  mi_heap_t *in_RDI;
  heap_page_visitor_fun *unaff_retaddr;
  mi_heap_t *in_stack_00000008;
  _Bool found;
  undefined7 in_stack_fffffffffffffff8;
  undefined1 in_stack_ffffffffffffffff;
  
  if (((in_RDI != (mi_heap_t *)0x0) && (_Var1 = mi_heap_is_initialized(in_RDI), _Var1)) &&
     ((in_RSI & 7) == 0)) {
    mi_heap_visit_pages(in_stack_00000008,unaff_retaddr,
                        (void *)CONCAT17(in_stack_ffffffffffffffff,in_stack_fffffffffffffff8),in_RDI
                       );
  }
  return false;
}

Assistant:

bool mi_heap_check_owned(mi_heap_t* heap, const void* p) {
  mi_assert(heap != NULL);
  if (heap==NULL || !mi_heap_is_initialized(heap)) return false;
  if (((uintptr_t)p & (MI_INTPTR_SIZE - 1)) != 0) return false;  // only aligned pointers
  bool found = false;
  mi_heap_visit_pages(heap, &mi_heap_page_check_owned, (void*)p, &found);
  return found;
}